

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O0

void easm_print_sexpr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  char *local_e0;
  char *local_b8;
  char *local_a0;
  char *local_90;
  char *local_80;
  char *local_70;
  char *local_50;
  int local_34;
  char *pcStack_30;
  int i;
  char *scol;
  int lvl_local;
  easm_expr *expr_local;
  envy_colors *cols_local;
  FILE *out_local;
  
  pcStack_30 = (char *)0x0;
  switch(expr->special) {
  case EASM_SPEC_NONE:
  case EASM_SPEC_LITERAL:
    break;
  case EASM_SPEC_ERR:
    pcStack_30 = cols->err;
    break;
  case EASM_SPEC_BTARG:
    pcStack_30 = cols->btarg;
    break;
  case EASM_SPEC_CTARG:
    pcStack_30 = cols->ctarg;
    break;
  case EASM_SPEC_REGSP:
    pcStack_30 = cols->regsp;
    break;
  default:
    abort();
  }
  if (((uint)lvl < 0x80000000) || (expr->type != EASM_EXPR_VEC)) {
    if ((lvl < 1) && (expr->type == EASM_EXPR_ADD)) {
      easm_print_sexpr(out,cols,expr->e1,0);
      fprintf((FILE *)out,"%s+%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e2,1);
    }
    else if ((lvl < 1) && (expr->type == EASM_EXPR_SUB)) {
      easm_print_sexpr(out,cols,expr->e1,0);
      fprintf((FILE *)out,"%s-%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e2,1);
    }
    else if ((lvl < 2) && (expr->type == EASM_EXPR_MUL)) {
      easm_print_sexpr(out,cols,expr->e1,1);
      fprintf((FILE *)out,"%s*%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e2,2);
    }
    else if ((lvl < 2) && (expr->type == EASM_EXPR_DIV)) {
      easm_print_sexpr(out,cols,expr->e1,1);
      fprintf((FILE *)out,"%s/%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e2,2);
    }
    else if ((lvl < 2) && (expr->type == EASM_EXPR_MOD)) {
      easm_print_sexpr(out,cols,expr->e1,1);
      fprintf((FILE *)out,"%s%%%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e2,2);
    }
    else if ((lvl < 3) && (expr->type == EASM_EXPR_NEG)) {
      fprintf((FILE *)out,"%s-%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e1,2);
    }
    else if ((lvl < 3) && (expr->type == EASM_EXPR_NOT)) {
      fprintf((FILE *)out,"%s~%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e1,2);
    }
    else if ((lvl < 3) && (expr->type == EASM_EXPR_LNOT)) {
      fprintf((FILE *)out,"%s!%s",cols->sym,cols->reset);
      easm_print_sexpr(out,cols,expr->e1,2);
    }
    else if (expr->type == EASM_EXPR_NUM) {
      if (pcStack_30 == (char *)0x0) {
        local_50 = cols->num;
      }
      else {
        local_50 = pcStack_30;
      }
      fprintf((FILE *)out,"%s0x%lx%s",local_50,expr->num,cols->reset);
      if (expr->alabel != (char *)0x0) {
        if (pcStack_30 == (char *)0x0) {
          local_70 = cols->num;
        }
        else {
          local_70 = pcStack_30;
        }
        fprintf((FILE *)out," %s/*%s %s#%s%s %s*/%s",cols->comm,cols->reset,local_70,expr->alabel,
                cols->reset,cols->comm,cols->reset);
      }
    }
    else if (expr->type == EASM_EXPR_REG) {
      if (pcStack_30 == (char *)0x0) {
        local_80 = cols->reg;
      }
      else {
        local_80 = pcStack_30;
      }
      fprintf((FILE *)out,"%s$%s%s",local_80,expr->str,cols->reset);
    }
    else if (expr->type == EASM_EXPR_LABEL) {
      if (pcStack_30 == (char *)0x0) {
        local_90 = cols->num;
      }
      else {
        local_90 = pcStack_30;
      }
      fprintf((FILE *)out,"%s#%s%s",local_90,expr->str,cols->reset);
    }
    else if (expr->type == EASM_EXPR_STR) {
      if (pcStack_30 == (char *)0x0) {
        local_a0 = cols->num;
      }
      else {
        local_a0 = pcStack_30;
      }
      fprintf((FILE *)out,"%s",local_a0);
      print_escaped_astr(out,&expr->astr);
      fprintf((FILE *)out,"%s",cols->reset);
    }
    else if (expr->type == EASM_EXPR_DISCARD) {
      fprintf((FILE *)out,"%s#%s",cols->sym,cols->reset);
    }
    else if (expr->type == EASM_EXPR_ZVEC) {
      fprintf((FILE *)out,"%s()%s",cols->sym,cols->reset);
    }
    else if (expr->type == EASM_EXPR_SINSN) {
      fprintf((FILE *)out,"%s(%s",cols->sym,cols->reset);
      easm_print_sinsn(out,cols,expr->sinsn);
      fprintf((FILE *)out,"%s)%s",cols->sym,cols->reset);
    }
    else if (expr->type == EASM_EXPR_SWIZZLE) {
      easm_print_sexpr(out,cols,expr->e1,3);
      fprintf((FILE *)out,"%s.",cols->rname);
      if (expr->swizzlesnum != 1) {
        fprintf((FILE *)out,"(");
      }
      for (local_34 = 0; local_34 < expr->swizzlesnum; local_34 = local_34 + 1) {
        if (local_34 != 0) {
          fprintf((FILE *)out," ");
        }
        if (expr->swizzles[local_34].str == (char *)0x0) {
          fprintf((FILE *)out,"%lu",expr->swizzles[local_34].num);
        }
        else {
          fprintf((FILE *)out,"%s",expr->swizzles[local_34].str);
        }
      }
      if (expr->swizzlesnum != 1) {
        fprintf((FILE *)out,")");
      }
      fprintf((FILE *)out,"%s",cols->reset);
    }
    else if ((expr->type < EASM_EXPR_MEM) || (EASM_EXPR_MEMME < expr->type)) {
      if (expr->type == EASM_EXPR_POS) {
        fprintf((FILE *)out,"%s$%s",cols->sym,cols->reset);
      }
      else {
        fprintf((FILE *)out,"%s(%s",cols->sym,cols->reset);
        easm_print_expr(out,cols,expr,-1);
        fprintf((FILE *)out,"%s)%s",cols->sym,cols->reset);
      }
    }
    else {
      if (expr->str == (char *)0x0) {
        local_b8 = "";
      }
      else {
        local_b8 = expr->str;
      }
      fprintf((FILE *)out,"%s%s[%s",cols->mem,local_b8,cols->reset);
      easm_print_mods(out,cols,expr->mods,1);
      easm_print_expr(out,cols,expr->e1,-1);
      if (expr->type != EASM_EXPR_MEM) {
        switch(expr->type) {
        case EASM_EXPR_MEMPP:
          fprintf((FILE *)out,"%s++%s",cols->mem,cols->reset);
          break;
        case EASM_EXPR_MEMMM:
          fprintf((FILE *)out,"%s--%s",cols->mem,cols->reset);
          break;
        case EASM_EXPR_MEMPE:
          fprintf((FILE *)out,"%s+=%s",cols->mem,cols->reset);
          break;
        case EASM_EXPR_MEMME:
          fprintf((FILE *)out,"%s-=%s",cols->mem,cols->reset);
          break;
        default:
          abort();
        }
        easm_print_expr(out,cols,expr->e2,-1);
      }
      fprintf((FILE *)out,"%s]%s",cols->mem,cols->reset);
      if (expr->special == EASM_SPEC_LITERAL) {
        if (pcStack_30 == (char *)0x0) {
          local_e0 = cols->num;
        }
        else {
          local_e0 = pcStack_30;
        }
        fprintf((FILE *)out," %s/*%s %s0x%lx%s %s*/%s",cols->comm,cols->reset,local_e0,expr->alit,
                cols->reset,cols->comm,cols->reset);
      }
    }
  }
  else {
    easm_print_sexpr(out,cols,expr->e1,-1);
    fprintf((FILE *)out,"%s:%s",cols->sym);
    easm_print_sexpr(out,cols,expr->e2,0);
  }
  return;
}

Assistant:

void easm_print_sexpr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	const char *scol = 0;
	switch (expr->special) {
		case EASM_SPEC_NONE:
		case EASM_SPEC_LITERAL:
			break;
		case EASM_SPEC_ERR:
			scol = cols->err;
			break;
		case EASM_SPEC_BTARG:
			scol = cols->btarg;
			break;
		case EASM_SPEC_CTARG:
			scol = cols->ctarg;
			break;
		case EASM_SPEC_REGSP:
			scol = cols->regsp;
			break;
		default:
			abort();
	}
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_sexpr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_ADD) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s+%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_SUB) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MUL) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s*%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_DIV) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s/%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MOD) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s%%%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NEG) {
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NOT) {
		fprintf(out, "%s~%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_LNOT) {
		fprintf(out, "%s!%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (expr->type == EASM_EXPR_NUM) {
		fprintf(out, "%s0x%"PRIx64"%s", scol?scol:cols->num, expr->num, cols->reset);
		if (expr->alabel) {
			fprintf(out, " %s/*%s %s#%s%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alabel, cols->reset, cols->comm, cols->reset);
		}
	} else if (expr->type == EASM_EXPR_REG) {
		fprintf(out, "%s$%s%s", scol?scol:cols->reg, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_LABEL) {
		fprintf(out, "%s#%s%s", scol?scol:cols->num, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_STR) {
		fprintf(out, "%s", scol?scol:cols->num);
		print_escaped_astr(out, &expr->astr);
		fprintf(out, "%s", cols->reset);
	} else if (expr->type == EASM_EXPR_DISCARD) {
		fprintf(out, "%s#%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_ZVEC) {
		fprintf(out, "%s()%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SINSN) {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_sinsn(out, cols, expr->sinsn);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SWIZZLE) {
		int i;
		easm_print_sexpr(out, cols, expr->e1, 3);
		fprintf(out, "%s.", cols->rname);
		if (expr->swizzlesnum != 1) {
			fprintf(out, "(");
		}
		for (i = 0; i < expr->swizzlesnum; i++) {
			if (i)
				fprintf(out, " ");
			if (expr->swizzles[i].str) {
				fprintf(out, "%s", expr->swizzles[i].str);
			} else {
				fprintf(out, "%"PRIu64, expr->swizzles[i].num);
			}
		}
		if (expr->swizzlesnum != 1) {
			fprintf(out, ")");
		}
		fprintf(out, "%s", cols->reset);
	} else if (expr->type >= EASM_EXPR_MEM && expr->type <= EASM_EXPR_MEMME) {
		fprintf(out, "%s%s[%s", cols->mem, expr->str?expr->str:"", cols->reset);
		easm_print_mods(out, cols, expr->mods, 1);
		easm_print_expr(out, cols, expr->e1, -1);
		if (expr->type != EASM_EXPR_MEM) {
			switch(expr->type) {
				case EASM_EXPR_MEMPP:
					fprintf(out, "%s++%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMMM:
					fprintf(out, "%s--%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMPE:
					fprintf(out, "%s+=%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMME:
					fprintf(out, "%s-=%s", cols->mem, cols->reset);
					break;
				default:
					abort();
			}
			easm_print_expr(out, cols, expr->e2, -1);
		}
		fprintf(out, "%s]%s", cols->mem, cols->reset);
		if (expr->special == EASM_SPEC_LITERAL)
			fprintf(out, " %s/*%s %s0x%"PRIx64"%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alit, cols->reset, cols->comm, cols->reset);
	} else if (expr->type == EASM_EXPR_POS) {
		fprintf(out, "%s$%s", cols->sym, cols->reset);
	} else {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr, -1);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	}
}